

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O2

void __thiscall
flow_cutter::ReachableNodeSet::
ReachableNodeSet<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
          (ReachableNodeSet *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph)

{
  BasicNodeSet::
  BasicNodeSet<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
            (&this->node_set,graph);
  ArrayIDFunc<int>::ArrayIDFunc(&this->predecessor,(graph->tail).original_node_count * 2);
  return;
}

Assistant:

explicit ReachableNodeSet(const Graph& graph)
        : node_set(graph)
        , predecessor(graph.node_count())
    {
    }